

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.cc
# Opt level: O2

int main(int argc,char **argv)

{
  InputOutputFormats output_format;
  ifstream *piVar1;
  ulong uVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  undefined7 uVar9;
  undefined8 uVar7;
  ostream *poVar8;
  long lVar10;
  char *pcVar11;
  long lVar12;
  byte bVar13;
  ostringstream *input_stream;
  int iVar14;
  allocator local_7f5;
  int fft_length;
  int num_denominator_order;
  int num_numerator_order;
  ifstream *local_7e8;
  ulong local_7e0;
  ulong local_7d8;
  double relative_floor_in_decibels;
  double epsilon;
  vector<double,_std::allocator<double>_> waveform;
  char *local_798;
  istream *local_790;
  vector<double,_std::allocator<double>_> numerator_coefficients;
  vector<double,_std::allocator<double>_> denominator_coefficients;
  vector<double,_std::allocator<double>_> output;
  ifstream ifs_for_denominator;
  byte abStack_720 [488];
  ostringstream error_message;
  byte abStack_518 [488];
  int tmp;
  bool local_260;
  Buffer buffer;
  FilterCoefficientsToSpectrum filter_coefficients_to_spectrum;
  
  fft_length = 0x100;
  num_numerator_order = 0;
  num_denominator_order = 0;
  epsilon = 0.0;
  relative_floor_in_decibels = -1.79769313486232e+308;
  local_7e0 = 0;
  local_7d8 = 0;
  local_798 = (char *)0x0;
  local_7e8 = (ifstream *)0x0;
  output_format = kLogAmplitudeSpectrumInDecibels;
  do {
    iVar6 = ya_getopt_long(argc,argv,"l:m:n:z:p:e:E:o:h",(option *)0x0,(int *)0x0);
    uVar9 = (undefined7)((ulong)ya_optarg >> 8);
    switch(iVar6) {
    case 0x65:
      std::__cxx11::string::string
                ((string *)&error_message,ya_optarg,(allocator *)&ifs_for_denominator);
      bVar5 = sptk::ConvertStringToDouble((string *)&error_message,&epsilon);
      bVar3 = epsilon <= 0.0;
      std::__cxx11::string::~string((string *)&error_message);
      if (!bVar5 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "The argument for the -e option must be a positive number");
        std::__cxx11::string::string((string *)&ifs_for_denominator,"spec",(allocator *)&tmp);
        sptk::PrintErrorMessage((string *)&ifs_for_denominator,&error_message);
        goto LAB_00103cd5;
      }
      break;
    case 0x66:
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
switchD_001036ec_caseD_66:
      anon_unknown.dwarf_2b05::PrintUsage((ostream *)&std::cerr);
      return 1;
    case 0x68:
      anon_unknown.dwarf_2b05::PrintUsage((ostream *)&std::cout);
      goto LAB_00103a98;
    case 0x6c:
      std::__cxx11::string::string
                ((string *)&error_message,ya_optarg,(allocator *)&ifs_for_denominator);
      bVar3 = sptk::ConvertStringToInteger((string *)&error_message,&fft_length);
      std::__cxx11::string::~string((string *)&error_message);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "The argument for the -l option must be an integer");
        std::__cxx11::string::string((string *)&ifs_for_denominator,"spec",(allocator *)&tmp);
        sptk::PrintErrorMessage((string *)&ifs_for_denominator,&error_message);
        goto LAB_00103cd5;
      }
      break;
    case 0x6d:
      std::__cxx11::string::string
                ((string *)&error_message,ya_optarg,(allocator *)&ifs_for_denominator);
      bVar3 = sptk::ConvertStringToInteger((string *)&error_message,&num_numerator_order);
      bVar5 = num_numerator_order < 0;
      uVar7 = std::__cxx11::string::~string((string *)&error_message);
      local_7d8 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
      if (!bVar3 || bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "The argument for the -m option must be a non-negative integer");
        std::__cxx11::string::string((string *)&ifs_for_denominator,"spec",(allocator *)&tmp);
        sptk::PrintErrorMessage((string *)&ifs_for_denominator,&error_message);
        goto LAB_00103cd5;
      }
      break;
    case 0x6e:
      std::__cxx11::string::string
                ((string *)&error_message,ya_optarg,(allocator *)&ifs_for_denominator);
      bVar3 = sptk::ConvertStringToInteger((string *)&error_message,&num_denominator_order);
      bVar5 = num_denominator_order < 0;
      uVar7 = std::__cxx11::string::~string((string *)&error_message);
      local_7e0 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
      if (!bVar3 || bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "The argument for the -n option must be a non-negative integer");
        std::__cxx11::string::string((string *)&ifs_for_denominator,"spec",(allocator *)&tmp);
        sptk::PrintErrorMessage((string *)&ifs_for_denominator,&error_message);
        goto LAB_00103cd5;
      }
      break;
    case 0x6f:
      std::__cxx11::string::string
                ((string *)&error_message,ya_optarg,(allocator *)&ifs_for_denominator);
      bVar3 = sptk::ConvertStringToInteger((string *)&error_message,&tmp);
      if (bVar3) {
        bVar3 = sptk::IsInRange(tmp,0,3);
        std::__cxx11::string::~string((string *)&error_message);
        output_format = tmp;
        if (bVar3) break;
      }
      else {
        std::__cxx11::string::~string((string *)&error_message);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      poVar8 = std::operator<<((ostream *)&error_message,
                               "The argument for the -o option must be an integer ");
      poVar8 = std::operator<<(poVar8,"in the range of ");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0);
      poVar8 = std::operator<<(poVar8," to ");
      std::ostream::operator<<((ostream *)poVar8,3);
      std::__cxx11::string::string
                ((string *)&ifs_for_denominator,"spec",(allocator *)&filter_coefficients_to_spectrum
                );
      sptk::PrintErrorMessage((string *)&ifs_for_denominator,&error_message);
      goto LAB_00103cd5;
    case 0x70:
      local_798 = ya_optarg;
      local_7e0 = CONCAT71(uVar9,1);
      break;
    default:
      if (iVar6 == 0x45) {
        std::__cxx11::string::string
                  ((string *)&error_message,ya_optarg,(allocator *)&ifs_for_denominator);
        bVar5 = sptk::ConvertStringToDouble((string *)&error_message,&relative_floor_in_decibels);
        bVar3 = 0.0 <= relative_floor_in_decibels;
        std::__cxx11::string::~string((string *)&error_message);
        if (!bVar5 || bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
          std::operator<<((ostream *)&error_message,
                          "The argument for the -E option must be a negative number");
          std::__cxx11::string::string((string *)&ifs_for_denominator,"spec",(allocator *)&tmp);
          sptk::PrintErrorMessage((string *)&ifs_for_denominator,&error_message);
LAB_00103cd5:
          std::__cxx11::string::~string((string *)&ifs_for_denominator);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
          return 1;
        }
      }
      else {
        if (iVar6 != 0x7a) {
          if (iVar6 != -1) goto switchD_001036ec_caseD_66;
          bVar3 = sptk::SetBinaryMode();
          uVar2 = local_7d8;
          if (!bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
            std::operator<<((ostream *)&error_message,"Cannot set translation mode");
            std::__cxx11::string::string((string *)&ifs_for_denominator,"spec",(allocator *)&tmp);
            sptk::PrintErrorMessage((string *)&ifs_for_denominator,&error_message);
            goto LAB_00103cd5;
          }
          bVar13 = (byte)local_7d8;
          if (((local_7d8 & 1) == 0) && ((local_7e0 & 1) == 0)) {
            if (1 < argc - ya_optind) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
              std::operator<<((ostream *)&error_message,"Too many input files");
              std::__cxx11::string::string((string *)&ifs_for_denominator,"spec",(allocator *)&tmp);
              sptk::PrintErrorMessage((string *)&ifs_for_denominator,&error_message);
              goto LAB_00103cd5;
            }
            if (argc == ya_optind) {
              pcVar11 = (char *)0x0;
            }
            else {
              pcVar11 = argv[ya_optind];
            }
            input_stream = &error_message;
            std::ifstream::ifstream(input_stream);
            if ((pcVar11 != (char *)0x0) &&
               (std::ifstream::open((char *)&error_message,(_Ios_Openmode)pcVar11),
               (abStack_518[*(long *)(_error_message + -0x18)] & 5) != 0)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs_for_denominator);
              poVar8 = std::operator<<((ostream *)&ifs_for_denominator,"Cannot open file ");
              std::operator<<(poVar8,pcVar11);
              std::__cxx11::string::string
                        ((string *)&tmp,"spec",(allocator *)&filter_coefficients_to_spectrum);
              sptk::PrintErrorMessage((string *)&tmp,(ostringstream *)&ifs_for_denominator);
              std::__cxx11::string::~string((string *)&tmp);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs_for_denominator);
              iVar6 = 1;
              bVar3 = false;
              goto LAB_00104634;
            }
            cVar4 = std::__basic_file<char>::is_open();
            if (cVar4 == '\0') {
              input_stream = (ostringstream *)&std::cin;
            }
            sptk::WaveformToSpectrum::WaveformToSpectrum
                      ((WaveformToSpectrum *)&tmp,fft_length,fft_length,output_format,epsilon,
                       relative_floor_in_decibels);
            filter_coefficients_to_spectrum._vptr_FilterCoefficientsToSpectrum =
                 (_func_int **)&PTR__Buffer_001148a0;
            filter_coefficients_to_spectrum._8_8_ = &PTR__Buffer_001147b0;
            filter_coefficients_to_spectrum._16_8_ = &PTR__Buffer_001147e0;
            memset(&filter_coefficients_to_spectrum.fast_fourier_transform_,0,0xa8);
            if (local_260 == false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs_for_denominator);
              std::operator<<((ostream *)&ifs_for_denominator,
                              "Failed to set condition for transformation");
              std::__cxx11::string::string((string *)&buffer,"spec",(allocator *)&waveform);
              sptk::PrintErrorMessage((string *)&buffer,(ostringstream *)&ifs_for_denominator);
              std::__cxx11::string::~string((string *)&buffer);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs_for_denominator);
              iVar6 = 1;
              bVar3 = false;
              goto LAB_0010461a;
            }
            iVar14 = fft_length / 2;
            std::vector<double,_std::allocator<double>_>::vector
                      (&waveform,(long)fft_length,(allocator_type *)&ifs_for_denominator);
            iVar14 = iVar14 + 1;
            std::vector<double,_std::allocator<double>_>::vector
                      (&numerator_coefficients,(long)iVar14,(allocator_type *)&ifs_for_denominator);
            iVar6 = 1;
            goto LAB_0010438e;
          }
          lVar10 = (long)num_numerator_order;
          lVar12 = (long)num_denominator_order;
          std::vector<double,_std::allocator<double>_>::vector
                    (&numerator_coefficients,lVar10 + 1U,(allocator_type *)&error_message);
          std::vector<double,_std::allocator<double>_>::vector
                    (&denominator_coefficients,lVar12 + 1U,(allocator_type *)&error_message);
          if ((((uVar2 & 1) == 0) || ((local_7e0 & 1) == 0)) ||
             (local_798 != (char *)0x0 && local_7e8 != (ifstream *)0x0)) {
            if (argc <= ya_optind) {
              local_790 = (istream *)&error_message;
              std::ifstream::ifstream(local_790);
              piVar1 = local_7e8;
              if ((local_7e8 != (ifstream *)0x0 & bVar13) == 1) {
                std::ifstream::open((char *)&error_message,(_Ios_Openmode)local_7e8);
                if ((abStack_518[*(long *)(_error_message + -0x18)] & 5) != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs_for_denominator);
                  poVar8 = std::operator<<((ostream *)&ifs_for_denominator,"Cannot open file ");
                  std::operator<<(poVar8,(char *)piVar1);
                  std::__cxx11::string::string
                            ((string *)&tmp,"spec",(allocator *)&filter_coefficients_to_spectrum);
                  sptk::PrintErrorMessage((string *)&tmp,(ostringstream *)&ifs_for_denominator);
                  std::__cxx11::string::~string((string *)&tmp);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs_for_denominator)
                  ;
                  iVar6 = 1;
                  bVar3 = false;
                  goto LAB_0010455a;
                }
              }
              else {
                *numerator_coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start = 1.0;
              }
              cVar4 = std::__basic_file<char>::is_open();
              if (cVar4 == '\0') {
                local_790 = (istream *)&std::cin;
              }
              local_7e8 = &ifs_for_denominator;
              std::ifstream::ifstream(local_7e8);
              if ((local_798 != (char *)0x0 & (byte)local_7e0) == 1) {
                std::ifstream::open((char *)&ifs_for_denominator,(_Ios_Openmode)local_798);
                if ((abStack_720[*(long *)(_ifs_for_denominator + -0x18)] & 5) != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
                  poVar8 = std::operator<<((ostream *)&tmp,"Cannot open file ");
                  std::operator<<(poVar8,local_798);
                  std::__cxx11::string::string
                            ((string *)&filter_coefficients_to_spectrum,"spec",(allocator *)&buffer)
                  ;
                  sptk::PrintErrorMessage
                            ((string *)&filter_coefficients_to_spectrum,(ostringstream *)&tmp);
                  std::__cxx11::string::~string((string *)&filter_coefficients_to_spectrum);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp);
                  iVar6 = 1;
                  bVar3 = false;
                  goto LAB_0010454d;
                }
              }
              else {
                *denominator_coefficients.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start = 1.0;
              }
              cVar4 = std::__basic_file<char>::is_open();
              if (cVar4 == '\0') {
                local_7e8 = (ifstream *)&std::cin;
              }
              sptk::FilterCoefficientsToSpectrum::FilterCoefficientsToSpectrum
                        (&filter_coefficients_to_spectrum,num_numerator_order,num_denominator_order,
                         fft_length,output_format,epsilon,relative_floor_in_decibels);
              buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_001147b0;
              buffer.fast_fourier_transform_buffer_._vptr_Buffer =
                   (_func_int **)&PTR__Buffer_001147e0;
              memset(&buffer.fast_fourier_transform_buffer_.real_part_input_,0,0xa8);
              if (filter_coefficients_to_spectrum.is_valid_ == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
                std::operator<<((ostream *)&tmp,"Failed to set condition for transformation");
                std::__cxx11::string::string((string *)&waveform,"spec",(allocator *)&output);
                sptk::PrintErrorMessage((string *)&waveform,(ostringstream *)&tmp);
                std::__cxx11::string::~string((string *)&waveform);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp);
                iVar6 = 1;
                bVar3 = false;
                goto LAB_00104533;
              }
              iVar6 = fft_length / 2 + 1;
              std::vector<double,_std::allocator<double>_>::vector
                        (&output,(long)iVar6,(allocator_type *)&tmp);
              goto LAB_001040a7;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
            std::operator<<((ostream *)&error_message,"Too many input files");
            std::__cxx11::string::string((string *)&ifs_for_denominator,"spec",(allocator *)&tmp);
            sptk::PrintErrorMessage((string *)&ifs_for_denominator,&error_message);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
            std::operator<<((ostream *)&error_message,
                            "Numerator and denominator coefficient files are required");
            std::__cxx11::string::string((string *)&ifs_for_denominator,"spec",(allocator *)&tmp);
            sptk::PrintErrorMessage((string *)&ifs_for_denominator,&error_message);
          }
          std::__cxx11::string::~string((string *)&ifs_for_denominator);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
          iVar6 = 1;
          bVar3 = false;
          goto LAB_00104567;
        }
        local_7e8 = (ifstream *)ya_optarg;
        local_7d8 = CONCAT71(uVar9,1);
      }
    }
  } while( true );
  while (bVar5 = sptk::WriteStream<double>
                           (0,iVar14,&numerator_coefficients,(ostream *)&std::cout,(int *)0x0),
        bVar5) {
LAB_0010438e:
    bVar3 = sptk::ReadStream<double>
                      (true,0,0,fft_length,&waveform,(istream *)input_stream,(int *)0x0);
    if (!bVar3) {
      iVar6 = 0;
      goto LAB_001045ff;
    }
    bVar5 = sptk::WaveformToSpectrum::Run
                      ((WaveformToSpectrum *)&tmp,&waveform,&numerator_coefficients,
                       (Buffer *)&filter_coefficients_to_spectrum);
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs_for_denominator);
      std::operator<<((ostream *)&ifs_for_denominator,"Failed to transform waveform to spectrum");
      std::__cxx11::string::string((string *)&buffer,"spec",(allocator *)&denominator_coefficients);
      sptk::PrintErrorMessage((string *)&buffer,(ostringstream *)&ifs_for_denominator);
      goto LAB_001045e5;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs_for_denominator);
  std::operator<<((ostream *)&ifs_for_denominator,"Failed to write spectrum");
  std::__cxx11::string::string((string *)&buffer,"spec",(allocator *)&denominator_coefficients);
  sptk::PrintErrorMessage((string *)&buffer,(ostringstream *)&ifs_for_denominator);
LAB_001045e5:
  std::__cxx11::string::~string((string *)&buffer);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs_for_denominator);
LAB_001045ff:
  bVar3 = !bVar3;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&numerator_coefficients.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&waveform.super__Vector_base<double,_std::allocator<double>_>);
LAB_0010461a:
  sptk::WaveformToSpectrum::Buffer::~Buffer((Buffer *)&filter_coefficients_to_spectrum);
  sptk::WaveformToSpectrum::~WaveformToSpectrum((WaveformToSpectrum *)&tmp);
LAB_00104634:
  std::ifstream::~ifstream(&error_message);
  goto LAB_00104581;
  while( true ) {
    bVar3 = sptk::FilterCoefficientsToSpectrum::Run
                      (&filter_coefficients_to_spectrum,&numerator_coefficients,
                       &denominator_coefficients,&output,&buffer);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
      std::operator<<((ostream *)&tmp,"Failed to transform filter coefficients to spectrum");
      std::__cxx11::string::string((string *)&waveform,"spec",&local_7f5);
      sptk::PrintErrorMessage((string *)&waveform,(ostringstream *)&tmp);
      goto LAB_0010450a;
    }
    bVar3 = sptk::WriteStream<double>(0,iVar6,&output,(ostream *)&std::cout,(int *)0x0);
    if (!bVar3) break;
LAB_001040a7:
    if ((((local_7d8 & 1) != 0) &&
        (bVar3 = sptk::ReadStream<double>
                           (false,0,0,(int)(lVar10 + 1U),&numerator_coefficients,local_790,
                            (int *)0x0), !bVar3)) ||
       (((local_7e0 & 1) != 0 &&
        (bVar3 = sptk::ReadStream<double>
                           (false,0,0,(int)(lVar12 + 1U),&denominator_coefficients,
                            (istream *)local_7e8,(int *)0x0), !bVar3)))) {
      iVar6 = 0;
      bVar3 = true;
      goto LAB_00104526;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
  std::operator<<((ostream *)&tmp,"Failed to write spectrum");
  std::__cxx11::string::string((string *)&waveform,"spec",&local_7f5);
  sptk::PrintErrorMessage((string *)&waveform,(ostringstream *)&tmp);
LAB_0010450a:
  std::__cxx11::string::~string((string *)&waveform);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp);
  iVar6 = 1;
  bVar3 = false;
LAB_00104526:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output.super__Vector_base<double,_std::allocator<double>_>);
LAB_00104533:
  sptk::FilterCoefficientsToSpectrum::Buffer::~Buffer(&buffer);
  sptk::FilterCoefficientsToSpectrum::~FilterCoefficientsToSpectrum
            (&filter_coefficients_to_spectrum);
LAB_0010454d:
  std::ifstream::~ifstream(&ifs_for_denominator);
LAB_0010455a:
  std::ifstream::~ifstream(&error_message);
LAB_00104567:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&denominator_coefficients.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&numerator_coefficients.super__Vector_base<double,_std::allocator<double>_>);
LAB_00104581:
  if (bVar3) {
LAB_00103a98:
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int main(int argc, char* argv[]) {
  int fft_length(kDefaultFftLength);
  int num_numerator_order(kDefaultNumNumeratorOrder);
  int num_denominator_order(kDefaultNumDenominatorOrder);
  const char* numerator_coefficients_file(NULL);
  const char* denominator_coefficients_file(NULL);
  bool is_numerator_specified(false);
  bool is_denominator_specified(false);
  double epsilon(0.0);
  double relative_floor_in_decibels(sptk::kMin);
  sptk::SpectrumToSpectrum::InputOutputFormats output_format(
      kDefaultOutputFormat);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "l:m:n:z:p:e:E:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("spec", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_numerator_order) ||
            num_numerator_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("spec", error_message);
          return 1;
        }
        is_numerator_specified = true;
        break;
      }
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &num_denominator_order) ||
            num_denominator_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -n option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("spec", error_message);
          return 1;
        }
        is_denominator_specified = true;
        break;
      }
      case 'z': {
        numerator_coefficients_file = optarg;
        is_numerator_specified = true;
        break;
      }
      case 'p': {
        denominator_coefficients_file = optarg;
        is_denominator_specified = true;
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToDouble(optarg, &epsilon) || epsilon <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be a positive number";
          sptk::PrintErrorMessage("spec", error_message);
          return 1;
        }
        break;
      }
      case 'E': {
        if (!sptk::ConvertStringToDouble(optarg, &relative_floor_in_decibels) ||
            0.0 <= relative_floor_in_decibels) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -E option must be a negative number";
          sptk::PrintErrorMessage("spec", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(
            static_cast<int>(sptk::SpectrumToSpectrum::kNumInputOutputFormats) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("spec", error_message);
          return 1;
        }
        output_format =
            static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("spec", error_message);
    return 1;
  }

  if (is_numerator_specified || is_denominator_specified) {
    const int numerator_length(num_numerator_order + 1);
    const int denominator_length(num_denominator_order + 1);
    std::vector<double> numerator_coefficients(numerator_length);
    std::vector<double> denominator_coefficients(denominator_length);

    if (is_numerator_specified && is_denominator_specified &&
        (NULL == numerator_coefficients_file ||
         NULL == denominator_coefficients_file)) {
      std::ostringstream error_message;
      error_message
          << "Numerator and denominator coefficient files are required";
      sptk::PrintErrorMessage("spec", error_message);
      return 1;
    }

    const int num_input_files(argc - optind);
    if (0 < num_input_files) {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("spec", error_message);
      return 1;
    }

    std::ifstream ifs_for_numerator;
    if (is_numerator_specified && NULL != numerator_coefficients_file) {
      ifs_for_numerator.open(numerator_coefficients_file,
                             std::ios::in | std::ios::binary);
      if (ifs_for_numerator.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << numerator_coefficients_file;
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }
    } else {
      numerator_coefficients[0] = 1.0;
    }
    std::istream& input_stream_for_numerator(
        ifs_for_numerator.is_open() ? ifs_for_numerator : std::cin);

    std::ifstream ifs_for_denominator;
    if (is_denominator_specified && NULL != denominator_coefficients_file) {
      ifs_for_denominator.open(denominator_coefficients_file,
                               std::ios::in | std::ios::binary);
      if (ifs_for_denominator.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << denominator_coefficients_file;
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }
    } else {
      denominator_coefficients[0] = 1.0;
    }
    std::istream& input_stream_for_denominator(
        ifs_for_denominator.is_open() ? ifs_for_denominator : std::cin);

    sptk::FilterCoefficientsToSpectrum filter_coefficients_to_spectrum(
        num_numerator_order, num_denominator_order, fft_length, output_format,
        epsilon, relative_floor_in_decibels);
    sptk::FilterCoefficientsToSpectrum::Buffer buffer;
    if (!filter_coefficients_to_spectrum.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to set condition for transformation";
      sptk::PrintErrorMessage("spec", error_message);
      return 1;
    }

    const int output_length(fft_length / 2 + 1);
    std::vector<double> output(output_length);
    while ((!is_numerator_specified ||
            sptk::ReadStream(false, 0, 0, numerator_length,
                             &numerator_coefficients,
                             &input_stream_for_numerator, NULL)) &&
           (!is_denominator_specified ||
            sptk::ReadStream(false, 0, 0, denominator_length,
                             &denominator_coefficients,
                             &input_stream_for_denominator, NULL))) {
      if (!filter_coefficients_to_spectrum.Run(numerator_coefficients,
                                               denominator_coefficients,
                                               &output, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to transform filter coefficients to spectrum";
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }

      if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write spectrum";
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }
    }
  } else {
    const int num_input_files(argc - optind);
    if (1 < num_input_files) {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("spec", error_message);
      return 1;
    }
    const char* input_file(0 == num_input_files ? NULL : argv[optind]);

    std::ifstream ifs;
    if (NULL != input_file) {
      ifs.open(input_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << input_file;
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    sptk::WaveformToSpectrum waveform_to_spectrum(fft_length, fft_length,
                                                  output_format, epsilon,
                                                  relative_floor_in_decibels);
    sptk::WaveformToSpectrum::Buffer buffer;
    if (!waveform_to_spectrum.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to set condition for transformation";
      sptk::PrintErrorMessage("spec", error_message);
      return 1;
    }

    const int output_length(fft_length / 2 + 1);
    std::vector<double> waveform(fft_length);
    std::vector<double> output(output_length);
    while (sptk::ReadStream(true, 0, 0, fft_length, &waveform, &input_stream,
                            NULL)) {
      if (!waveform_to_spectrum.Run(waveform, &output, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to spectrum";
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }

      if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write spectrum";
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }
    }
  }

  return 0;
}